

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_edge_to_cellcenter
               (MultiFab *cc,int dcomp,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *edge,
               int ngrow)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Box bx;
  MFIter mfi;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::growntilebox(&local_1ac,&local_90,ngrow);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,
                 &(*(edge->
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
                    .
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,
                 &(edge->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,
                 &(edge->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[2]->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar11 = (long)local_1ac.smallend.vect[0] * 8;
        iVar7 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar10 = (long)local_190.begin.x;
            lVar12 = (iVar7 - local_190.begin.z) * local_190.kstride;
            lVar1 = (iVar7 - local_150.begin.z) * local_150.kstride * 8 +
                    (long)local_150.begin.x * -8 + lVar11;
            lVar5 = (long)((iVar7 + 1) - local_d0.begin.z) * local_d0.kstride * 8 +
                    (long)local_d0.begin.x * -8 + lVar11;
            lVar6 = local_d0.kstride * 8 * (long)(iVar7 - local_d0.begin.z) +
                    (long)local_d0.begin.x * -8 + lVar11;
            lVar15 = (long)local_1ac.smallend.vect[1];
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar8 = (lVar15 - local_190.begin.y) * local_190.jstride * 8;
                lVar14 = (lVar15 - local_110.begin.y) * local_110.jstride * 8;
                lVar2 = (lVar15 - local_150.begin.y) * local_150.jstride * 8 + lVar1;
                lVar3 = ((lVar15 + 1) - (long)local_150.begin.y) * local_150.jstride * 8 + lVar1;
                lVar4 = lVar14 + (long)((iVar7 + 1) - local_110.begin.z) * local_110.kstride * 8 +
                                 (long)local_110.begin.x * -8 + lVar11 + 8;
                lVar14 = lVar14 + local_110.kstride * 8 * (long)(iVar7 - local_110.begin.z) +
                                  (long)local_110.begin.x * -8 + lVar11 + 8;
                lVar16 = (lVar15 - local_d0.begin.y) * local_d0.jstride * 8;
                lVar13 = ((lVar15 + 1) - (long)local_d0.begin.y) * local_d0.jstride * 8;
                lVar9 = 0;
                do {
                  *(double *)
                   ((long)local_190.p +
                   lVar9 * 8 +
                   lVar8 + (long)dcomp * 8 * local_190.nstride + lVar12 * 8 + lVar10 * -8 + lVar11)
                       = (*(double *)((long)local_d0.p + lVar9 * 8 + lVar16 + lVar6) +
                          *(double *)((long)local_d0.p + lVar9 * 8 + lVar13 + lVar6) +
                          *(double *)((long)local_d0.p + lVar9 * 8 + lVar16 + lVar5) +
                         *(double *)((long)local_d0.p + lVar9 * 8 + lVar13 + lVar5)) * 0.25;
                  *(double *)
                   ((long)local_190.p +
                   lVar9 * 8 +
                   lVar8 + (long)(dcomp + 1) * 8 * local_190.nstride + lVar12 * 8 + lVar10 * -8 +
                           lVar11) =
                       (*(double *)((long)local_110.p + lVar9 * 8 + lVar14 + -8) +
                        *(double *)((long)local_110.p + lVar9 * 8 + lVar14) +
                        *(double *)((long)local_110.p + lVar9 * 8 + lVar4 + -8) +
                       *(double *)((long)local_110.p + lVar9 * 8 + lVar4)) * 0.25;
                  *(double *)
                   ((long)local_190.p +
                   lVar9 * 8 +
                   lVar8 + local_190.nstride * (long)(dcomp + 2) * 8 + lVar12 * 8 + lVar10 * -8 +
                           lVar11) =
                       (*(double *)((long)local_150.p + lVar9 * 8 + lVar2) +
                        *(double *)((long)local_150.p + lVar9 * 8 + lVar2 + 8) +
                        *(double *)((long)local_150.p + lVar9 * 8 + lVar3) +
                       *(double *)((long)local_150.p + lVar9 * 8 + lVar3 + 8)) * 0.25;
                  lVar9 = lVar9 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar9);
              }
              lVar15 = lVar15 + 1;
            } while (local_1ac.bigend.vect[1] + 1 != (int)lVar15);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != local_1ac.bigend.vect[2] + 1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_edge_to_cellcenter (MultiFab& cc, int dcomp,
        const Vector<const MultiFab*>& edge, int ngrow)
    {
        AMREX_ASSERT(cc.nComp() >= dcomp + AMREX_SPACEDIM);
        AMREX_ASSERT(edge.size() == AMREX_SPACEDIM);
        AMREX_ASSERT(edge[0]->nComp() == 1);
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& exma = edge[0]->const_arrays();,
                         auto const& eyma = edge[1]->const_arrays();,
                         auto const& ezma = edge[2]->const_arrays(););
            ParallelFor(cc, IntVect(ngrow),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_eg_to_cc(i, j, k, ccma[box_no],
                                   AMREX_D_DECL(exma[box_no], eyma[box_no], ezma[box_no]),
                                   dcomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& exarr = edge[0]->const_array(mfi);,
                             Array4<Real const> const& eyarr = edge[1]->const_array(mfi);,
                             Array4<Real const> const& ezarr = edge[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_eg_to_cc(i, j, k, ccarr, AMREX_D_DECL(exarr,eyarr,ezarr), dcomp);
                });
            }
        }
    }